

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O2

string * __thiscall
slang::OS::parseEnvVar_abi_cxx11_(string *__return_storage_ptr__,OS *this,char **ptr,char *end)

{
  char c;
  char *pcVar1;
  char **ppcVar2;
  char cVar3;
  bool bVar4;
  string varName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = *(char **)this;
  *(char **)this = pcVar1 + 1;
  c = *pcVar1;
  if ((c == '{') || (c == '(')) {
    cVar3 = '}';
    if (c == '(') {
      cVar3 = ')';
    }
    varName._M_dataplus._M_p = (pointer)&varName.field_2;
    varName._M_string_length = 0;
    varName.field_2._M_local_buf[0] = '\0';
    while (ppcVar2 = *(char ***)this, ppcVar2 != ptr) {
      *(char **)this = (char *)((long)ppcVar2 + 1);
      if (cVar3 == *(char *)ppcVar2) {
        getEnv(__return_storage_ptr__,&varName);
        goto LAB_001b873b;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&varName,*(char *)ppcVar2);
    }
    s_abi_cxx11_(&local_70,"$",1);
    std::operator+(&local_50,&local_70,c);
    std::operator+(__return_storage_ptr__,&local_50,&varName);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar4 = isValidCIdChar(c);
    if (bVar4) {
      varName._M_dataplus._M_p = (pointer)&varName.field_2;
      varName._M_string_length = 0;
      varName.field_2._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&varName,c);
      while (*(char ***)this != ptr) {
        bVar4 = isValidCIdChar(*(char *)*(char ***)this);
        if (!bVar4) break;
        pcVar1 = *(char **)this;
        *(char **)this = pcVar1 + 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&varName,*pcVar1);
      }
      getEnv(__return_storage_ptr__,&varName);
    }
    else {
      s_abi_cxx11_(&varName,"$",1);
      std::operator+(__return_storage_ptr__,&varName,c);
    }
  }
LAB_001b873b:
  std::__cxx11::string::~string((string *)&varName);
  return __return_storage_ptr__;
}

Assistant:

std::string OS::parseEnvVar(const char*& ptr, const char* end) {
    // Three forms for environment variables to try:
    // $VAR
    // $(VAR)
    // ${VAR}
    char c = *ptr++;
    if (c == '(' || c == '{') {
        char startDelim = c;
        char endDelim = c == '(' ? ')' : '}';
        std::string varName;
        while (ptr != end) {
            c = *ptr++;
            if (c == endDelim)
                return OS::getEnv(varName);

            varName += c;
        }

        // If we reach the end, we didn't find a closing delimiter.
        // Don't try to expand, just return the whole thing we collected.
        return "$"s + startDelim + varName;
    }
    else if (isValidCIdChar(c)) {
        std::string varName;
        varName += c;
        while (ptr != end && isValidCIdChar(*ptr))
            varName += *ptr++;

        return OS::getEnv(varName);
    }
    else {
        // This is not a possible variable name so just return what we have.
        return "$"s + c;
    }
}